

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O2

char sdsReqType(size_t string_size)

{
  char cVar1;
  
  if (string_size < 0x20) {
    cVar1 = '\0';
  }
  else {
    cVar1 = '\x01';
    if ((0xfe < string_size) && (cVar1 = '\x02', 0xfffe < string_size)) {
      return '\x04' - (string_size < 0xffffffff);
    }
  }
  return cVar1;
}

Assistant:

static inline char sdsReqType(size_t string_size) {
    if (string_size < 32)
        return SDS_TYPE_5;
    if (string_size < 0xff)
        return SDS_TYPE_8;
    if (string_size < 0xffff)
        return SDS_TYPE_16;
    if (string_size < 0xffffffff)
        return SDS_TYPE_32;
    return SDS_TYPE_64;
}